

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::toTerrain(Mesh *__return_storage_ptr__,Image *_image,float _zScale,float _maxError,
                      float _baseHeight,int _maxTriangles,int _maxPoints)

{
  pointer *ppvVar1;
  size_t *psVar2;
  allocator<std::pair<int,_float>_> *paVar3;
  __node_base_ptr *this;
  pointer *this_00;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar4;
  int a_00;
  int b_00;
  int b_01;
  uint32_t index1;
  uint32_t index2;
  ivec2 p0_00;
  ivec2 p1_00;
  ivec2 p1_01;
  mapped_type mVar5;
  Image *pIVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  float z_00;
  reference pvVar12;
  size_type sVar13;
  reference __args;
  undefined4 extraout_var;
  pointer *ppiVar14;
  reference piVar15;
  reference pvVar16;
  reference __args_1;
  reference __args_2;
  ulong uVar17;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar18;
  mapped_type *pmVar19;
  iterator iVar20;
  iterator iVar21;
  reference pvVar22;
  reference _point;
  reference _uv;
  reference this_01;
  uint32_t *puVar23;
  float extraout_XMM0_Da;
  ivec3 *tri;
  iterator __end1_4;
  iterator __begin1_4;
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  *__range1_4;
  vec2 *t_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *__range1_3;
  vec3 *p_3;
  iterator __end1_2;
  iterator __begin1_2;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *__range1_2;
  mapped_type local_558;
  int p11_3;
  int p10_3;
  int p01_3;
  int p00_3;
  float z1_3;
  float z0_3;
  int x1_2;
  int x0_2;
  int i_5;
  int p11_2;
  int p10_2;
  int p01_2;
  int p00_2;
  float z1_2;
  float z0_2;
  int x1_1;
  int x0_1;
  int i_4;
  int p11_1;
  int p10_1;
  int p01_1;
  int p00_1;
  float z1_1;
  float z0_1;
  int y1_2;
  int y0_2;
  int i_3;
  int p11;
  int p10;
  int p01;
  int p00;
  float z1;
  float z0;
  int y1_1;
  int y0_1;
  int i_2;
  int center;
  anon_class_40_5_2ea28a1b pointIndex;
  undefined1 local_488 [8];
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> sy1s;
  undefined1 local_458 [8];
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> sy0s;
  undefined1 local_428 [8];
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> sx1s;
  undefined1 local_3f8 [8];
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> sx0s;
  int local_3d8;
  int local_3d4;
  int local_3d0;
  char local_3c9;
  reference pvStack_3c8;
  bool edge;
  value_type *p_2;
  undefined1 local_3b8 [4];
  int i_1;
  unordered_map<glm::vec<3,_float,_(glm::qualifier)0>,_int,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>_>
  lookup;
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> y1s;
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> y0s;
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> x1s;
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> x0s;
  float z;
  int i;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  triangles;
  float local_280;
  int local_27c;
  reference local_278;
  ivec2 *p_1;
  iterator __end1;
  iterator __begin1;
  vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  *__range1;
  int h1;
  int w1;
  int h;
  int w;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  points;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texcoords;
  int t2;
  int t1;
  int t0_1;
  int h2;
  int h1_1;
  int h0;
  anon_class_8_1_898a9ca8 local_1b8;
  anon_class_8_1_898a9ca8 handleCollinear;
  anon_class_1_0_00000001 collinear;
  value_type vStack_1a8;
  int pn;
  ivec2 p;
  ivec2 c;
  ivec2 b;
  ivec2 a;
  int p2_1;
  int p1_1;
  int p0_1;
  int e2;
  int e1;
  int e0;
  int t;
  anon_class_32_4_01afa5de done;
  int t0;
  int local_138;
  int p3;
  int local_12c;
  int p2;
  int local_120;
  int p1;
  int local_114;
  int local_110;
  int p0;
  int y1;
  int local_fc;
  undefined4 local_f8;
  int x1;
  int y0;
  int x0;
  TriangulatorData data;
  float local_28;
  int _maxPoints_local;
  int _maxTriangles_local;
  float _baseHeight_local;
  float _maxError_local;
  float _zScale_local;
  Image *_image_local;
  Mesh *mesh;
  
  data.pending.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = _maxPoints;
  local_28 = (float)_maxTriangles;
  _maxPoints_local = (int)_baseHeight;
  _maxTriangles_local = (int)_maxError;
  _baseHeight_local = _zScale;
  __maxError_local = _image;
  _image_local = (Image *)__return_storage_ptr__;
  iVar8 = (*_image->_vptr_Image[8])();
  if (iVar8 == 1) {
    TriangulatorData::TriangulatorData((TriangulatorData *)&y0);
    x1 = 0;
    local_f8 = 0;
    local_fc = (*__maxError_local->_vptr_Image[6])();
    local_fc = local_fc + -1;
    local_110 = (*__maxError_local->_vptr_Image[7])();
    local_110 = local_110 + -1;
    glm::vec<2,_int,_(glm::qualifier)0>::vec
              ((vec<2,_int,_(glm::qualifier)0> *)&stack0xfffffffffffffee4,0,0);
    local_114 = TriangulatorData::AddPoint
                          ((TriangulatorData *)&y0,(ivec2 *)&stack0xfffffffffffffee4);
    glm::vec<2,_int,_(glm::qualifier)0>::vec
              ((vec<2,_int,_(glm::qualifier)0> *)&stack0xfffffffffffffed8,local_fc,0);
    local_120 = TriangulatorData::AddPoint
                          ((TriangulatorData *)&y0,(ivec2 *)&stack0xfffffffffffffed8);
    glm::vec<2,_int,_(glm::qualifier)0>::vec
              ((vec<2,_int,_(glm::qualifier)0> *)&stack0xfffffffffffffecc,0,local_110);
    local_12c = TriangulatorData::AddPoint
                          ((TriangulatorData *)&y0,(ivec2 *)&stack0xfffffffffffffecc);
    glm::vec<2,_int,_(glm::qualifier)0>::vec
              ((vec<2,_int,_(glm::qualifier)0> *)&stack0xfffffffffffffec0,local_fc,local_110);
    local_138 = TriangulatorData::AddPoint
                          ((TriangulatorData *)&y0,(ivec2 *)&stack0xfffffffffffffec0);
    done._maxPoints._4_4_ =
         TriangulatorData::AddTriangle
                   ((TriangulatorData *)&y0,local_138,local_114,local_12c,-1,-1,-1,-1);
    TriangulatorData::AddTriangle
              ((TriangulatorData *)&y0,local_114,local_138,local_120,done._maxPoints._4_4_,-1,-1,-1)
    ;
    TriangulatorData::Flush((TriangulatorData *)&y0,__maxError_local);
    _e0 = (TriangulatorData *)&y0;
    done.data = (TriangulatorData *)&_maxTriangles_local;
    done._maxError = &local_28;
    done._maxTriangles =
         (int *)((long)&data.pending.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4);
    while (bVar7 = toTerrain::anon_class_32_4_01afa5de::operator()((anon_class_32_4_01afa5de *)&e0),
          ((bVar7 ^ 0xffU) & 1) != 0) {
      iVar9 = TriangulatorData::QueuePop((TriangulatorData *)&y0);
      iVar10 = iVar9 * 3;
      iVar8 = iVar9 * 3 + 1;
      iVar11 = iVar9 * 3 + 2;
      ppvVar1 = &data.points.
                 super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)ppvVar1,(long)iVar10);
      a_00 = *pvVar16;
      pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)ppvVar1,(long)iVar8);
      b_00 = *pvVar16;
      pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)ppvVar1,(long)iVar11);
      b_01 = *pvVar16;
      pvVar12 = std::
                vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                ::operator[]((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                              *)&y0,(long)a_00);
      p0_00.field_0 = pvVar12->field_0;
      p0_00.field_1 = pvVar12->field_1;
      pvVar12 = std::
                vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                ::operator[]((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                              *)&y0,(long)b_00);
      p1_00.field_0 = pvVar12->field_0;
      p1_00.field_1 = pvVar12->field_1;
      pvVar12 = std::
                vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                ::operator[]((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                              *)&y0,(long)b_01);
      p1_01.field_0 = pvVar12->field_0;
      p1_01.field_1 = pvVar12->field_1;
      pvVar12 = std::
                vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                ::operator[]((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                              *)&data.halfedges.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar9);
      vStack_1a8 = *pvVar12;
      handleCollinear.data._4_4_ =
           TriangulatorData::AddPoint((TriangulatorData *)&y0,&stack0xfffffffffffffe58);
      local_1b8.data = (TriangulatorData *)&y0;
      bVar7 = toTerrain::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&handleCollinear.data + 3),p0_00,p1_00,
                         vStack_1a8);
      if (bVar7) {
        toTerrain::anon_class_8_1_898a9ca8::operator()(&local_1b8,handleCollinear.data._4_4_,iVar10)
        ;
      }
      else {
        bVar7 = toTerrain::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&handleCollinear.data + 3),p1_00,p1_01,
                           vStack_1a8);
        if (bVar7) {
          toTerrain::anon_class_8_1_898a9ca8::operator()
                    (&local_1b8,handleCollinear.data._4_4_,iVar8);
        }
        else {
          bVar7 = toTerrain::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)((long)&handleCollinear.data + 3),p1_01,
                             p0_00,vStack_1a8);
          if (bVar7) {
            toTerrain::anon_class_8_1_898a9ca8::operator()
                      (&local_1b8,handleCollinear.data._4_4_,iVar11);
          }
          else {
            ppiVar14 = &data.triangles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
            pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)ppiVar14,(long)iVar10);
            iVar9 = *pvVar16;
            pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)ppiVar14,(long)iVar8);
            iVar8 = *pvVar16;
            pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)ppiVar14,(long)iVar11);
            iVar11 = *pvVar16;
            iVar10 = TriangulatorData::AddTriangle
                               ((TriangulatorData *)&y0,a_00,b_00,handleCollinear.data._4_4_,iVar9,
                                -1,-1,iVar10);
            iVar8 = TriangulatorData::AddTriangle
                              ((TriangulatorData *)&y0,b_00,b_01,handleCollinear.data._4_4_,iVar8,-1
                               ,iVar10 + 1,-1);
            iVar11 = TriangulatorData::AddTriangle
                               ((TriangulatorData *)&y0,b_01,a_00,handleCollinear.data._4_4_,iVar11,
                                iVar10 + 2,iVar8 + 1,-1);
            TriangulatorData::Legalize((TriangulatorData *)&y0,iVar10);
            TriangulatorData::Legalize((TriangulatorData *)&y0,iVar8);
            TriangulatorData::Legalize((TriangulatorData *)&y0,iVar11);
          }
        }
      }
      TriangulatorData::Flush((TriangulatorData *)&y0,__maxError_local);
    }
    std::
    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              *)&points.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&h);
    sVar13 = std::
             vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
             ::size((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                     *)&y0);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::reserve((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)&h,sVar13);
    sVar13 = std::
             vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
             ::size((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                     *)&y0);
    std::
    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ::reserve((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)&points.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar13);
    w1 = (*__maxError_local->_vptr_Image[6])();
    h1 = (*__maxError_local->_vptr_Image[7])();
    __range1._4_4_ = w1 + -1;
    __range1._0_4_ = h1 + -1;
    __end1 = std::
             vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
             ::begin((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                      *)&y0);
    p_1 = (ivec2 *)std::
                   vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                   ::end((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                          *)&y0);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<glm::vec<2,_int,_(glm::qualifier)0>_*,_std::vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>_>
                                       *)&p_1), bVar7) {
      __args = __gnu_cxx::
               __normal_iterator<glm::vec<2,_int,_(glm::qualifier)0>_*,_std::vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>_>
               ::operator*(&__end1);
      pIVar6 = __maxError_local;
      local_27c = (int)__range1 - (__args->field_1).y;
      local_278 = __args;
      iVar8 = (*__maxError_local->_vptr_Image[0xe])
                        (__maxError_local,(long)(__args->field_0).x,(long)(__args->field_1).y);
      (*pIVar6->_vptr_Image[0x18])(pIVar6,CONCAT44(extraout_var,iVar8));
      local_280 = extraout_XMM0_Da * _baseHeight_local;
      std::
      vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
      ::emplace_back<int_const&,int,float>
                ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                  *)&h,(int *)__args,&local_27c,&local_280);
      triangles.
      super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           (float)(local_278->field_0).x / (float)__range1._4_4_;
      triangles.
      super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           1.0 - (float)(local_278->field_1).y / (float)(int)__range1;
      std::
      vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
      ::emplace_back<float,float>
                ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                  *)&points.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (float *)((long)&triangles.
                                  super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                 (float *)&triangles.
                           super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<glm::vec<2,_int,_(glm::qualifier)0>_*,_std::vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>_>
      ::operator++(&__end1);
    }
    std::
    vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
    ::vector((vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
              *)&__range1_1);
    sVar13 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)
                        &data.queueIndexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
    ::reserve((vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
               *)&__range1_1,sVar13);
    ppiVar14 = &data.queueIndexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    __end1_1 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)ppiVar14);
    _z = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)ppiVar14);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &z), bVar7) {
      piVar15 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1_1);
      iVar8 = *piVar15;
      ppvVar1 = &data.points.
                 super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)ppvVar1,(long)(iVar8 * 3));
      __args_1 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)ppvVar1,(long)(iVar8 * 3 + 1));
      __args_2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)ppvVar1,(long)(iVar8 * 3 + 2));
      std::
      vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>::
      emplace_back<int&,int&,int&>
                ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                  *)&__range1_1,pvVar16,__args_1,__args_2);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1_1);
    }
    if (0.0 < (float)_maxPoints_local) {
      z_00 = -(float)_maxPoints_local;
      std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::map
                ((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *)
                 &x1s._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::map
                ((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *)
                 &y0s._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::map
                ((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *)
                 &y1s._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::map
                ((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *)
                 &lookup._M_h._M_single_bucket);
      std::
      unordered_map<glm::vec<3,_float,_(glm::qualifier)0>,_int,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>_>
      ::unordered_map((unordered_map<glm::vec<3,_float,_(glm::qualifier)0>,_int,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>_>
                       *)local_3b8);
      for (p_2._4_4_ = 0; uVar17 = (ulong)p_2._4_4_,
          sVar13 = std::
                   vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           *)&h), uVar17 < sVar13; p_2._4_4_ = p_2._4_4_ + 1) {
        pvStack_3c8 = std::
                      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    *)&h,(long)p_2._4_4_);
        local_3c9 = '\0';
        if (((pvStack_3c8->field_0).x != 0.0) || (NAN((pvStack_3c8->field_0).x))) {
          if (((pvStack_3c8->field_0).x == (float)__range1._4_4_) &&
             (!NAN((pvStack_3c8->field_0).x) && !NAN((float)__range1._4_4_))) {
            aVar4 = pvStack_3c8->field_2;
            local_3d4 = (int)(pvStack_3c8->field_1).y;
            paVar18 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
                      std::
                      map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                      ::operator[]((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                    *)&y0s._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   &local_3d4);
            *paVar18 = aVar4;
            local_3c9 = '\x01';
          }
        }
        else {
          aVar4 = pvStack_3c8->field_2;
          local_3d0 = (int)(pvStack_3c8->field_1).y;
          paVar18 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
                    std::
                    map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
                    operator[]((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                *)&x1s._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_3d0);
          *paVar18 = aVar4;
          local_3c9 = '\x01';
        }
        if (((pvStack_3c8->field_1).y != 0.0) || (NAN((pvStack_3c8->field_1).y))) {
          if (((pvStack_3c8->field_1).y == (float)(int)__range1) &&
             (!NAN((pvStack_3c8->field_1).y) && !NAN((float)(int)__range1))) {
            aVar4 = pvStack_3c8->field_2;
            sx0s.super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)(pvStack_3c8->field_0).x;
            paVar18 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
                      std::
                      map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                      ::operator[]((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                    *)&lookup._M_h._M_single_bucket,
                                   (key_type_conflict *)
                                   ((long)&sx0s.
                                           super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
            *paVar18 = aVar4;
            local_3c9 = '\x01';
          }
        }
        else {
          aVar4 = pvStack_3c8->field_2;
          local_3d8 = (int)(pvStack_3c8->field_0).x;
          paVar18 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
                    std::
                    map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
                    operator[]((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                *)&y1s._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_3d8);
          *paVar18 = aVar4;
          local_3c9 = '\x01';
        }
        mVar5 = p_2._4_4_;
        if (local_3c9 != '\0') {
          pmVar19 = std::
                    unordered_map<glm::vec<3,_float,_(glm::qualifier)0>,_int,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>_>
                    ::operator[]((unordered_map<glm::vec<3,_float,_(glm::qualifier)0>,_int,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>_>
                                  *)local_3b8,pvStack_3c8);
          *pmVar19 = mVar5;
        }
      }
      psVar2 = &x1s._M_t._M_impl.super__Rb_tree_header._M_node_count;
      iVar20 = std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
               begin((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                      *)psVar2);
      iVar21 = std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
               end((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *
                   )psVar2);
      paVar3 = (allocator<std::pair<int,_float>_> *)
               ((long)&sx1s.
                       super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<std::pair<int,_float>_>::allocator(paVar3);
      std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
      vector<std::_Rb_tree_iterator<std::pair<int_const,float>>,void>
                ((vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)local_3f8,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)iVar20._M_node,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)iVar21._M_node,paVar3);
      std::allocator<std::pair<int,_float>_>::~allocator
                ((allocator<std::pair<int,_float>_> *)
                 ((long)&sx1s.
                         super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      psVar2 = &y0s._M_t._M_impl.super__Rb_tree_header._M_node_count;
      iVar20 = std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
               begin((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                      *)psVar2);
      iVar21 = std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
               end((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *
                   )psVar2);
      paVar3 = (allocator<std::pair<int,_float>_> *)
               ((long)&sy0s.
                       super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<std::pair<int,_float>_>::allocator(paVar3);
      std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
      vector<std::_Rb_tree_iterator<std::pair<int_const,float>>,void>
                ((vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)local_428,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)iVar20._M_node,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)iVar21._M_node,paVar3);
      std::allocator<std::pair<int,_float>_>::~allocator
                ((allocator<std::pair<int,_float>_> *)
                 ((long)&sy0s.
                         super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      psVar2 = &y1s._M_t._M_impl.super__Rb_tree_header._M_node_count;
      iVar20 = std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
               begin((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                      *)psVar2);
      iVar21 = std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
               end((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *
                   )psVar2);
      paVar3 = (allocator<std::pair<int,_float>_> *)
               ((long)&sy1s.
                       super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<std::pair<int,_float>_>::allocator(paVar3);
      std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
      vector<std::_Rb_tree_iterator<std::pair<int_const,float>>,void>
                ((vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)local_458,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)iVar20._M_node,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)iVar21._M_node,paVar3);
      std::allocator<std::pair<int,_float>_>::~allocator
                ((allocator<std::pair<int,_float>_> *)
                 ((long)&sy1s.
                         super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      this = &lookup._M_h._M_single_bucket;
      iVar20 = std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
               begin((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                      *)this);
      iVar21 = std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
               end((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *
                   )this);
      paVar3 = (allocator<std::pair<int,_float>_> *)((long)&pointIndex.h1 + 7);
      std::allocator<std::pair<int,_float>_>::allocator(paVar3);
      std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
      vector<std::_Rb_tree_iterator<std::pair<int_const,float>>,void>
                ((vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)local_488,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)iVar20._M_node,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)iVar21._M_node,paVar3);
      std::allocator<std::pair<int,_float>_>::~allocator
                ((allocator<std::pair<int,_float>_> *)((long)&pointIndex.h1 + 7));
      _i_2 = (unordered_map<glm::vec<3,_float,_(glm::qualifier)0>,_int,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>_>
              *)local_3b8;
      pointIndex.lookup =
           (unordered_map<glm::vec<3,_float,_(glm::qualifier)0>,_int,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>_>
            *)&h;
      pointIndex.points =
           (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)&points.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pointIndex.texcoords =
           (vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)((long)&__range1 + 4);
      pointIndex.w1 = (int *)&__range1;
      y0_1 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                       ((anon_class_40_5_2ea28a1b *)&i_2,(float)w1 * 0.5,(float)h1 * 0.5,z_00);
      for (y1_1 = 1; uVar17 = (ulong)y1_1,
          sVar13 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::size
                             ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               *)local_3f8), uVar17 < sVar13; y1_1 = y1_1 + 1) {
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_3f8,(long)(y1_1 + -1));
        z0 = (float)pvVar22->first;
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_3f8,(long)y1_1);
        z1 = (float)pvVar22->first;
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_3f8,(long)(y1_1 + -1));
        p00 = (int)pvVar22->second;
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_3f8,(long)y1_1);
        p01 = (int)pvVar22->second;
        p10 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        ((anon_class_40_5_2ea28a1b *)&i_2,0.0,(float)(int)z0,z_00);
        p11 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        ((anon_class_40_5_2ea28a1b *)&i_2,0.0,(float)(int)z0,(float)p00);
        i_3 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        ((anon_class_40_5_2ea28a1b *)&i_2,0.0,(float)(int)z1,z_00);
        y0_2 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                         ((anon_class_40_5_2ea28a1b *)&i_2,0.0,(float)(int)z1,(float)p01);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&__range1_1,&p11,&i_3,&p10);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&__range1_1,&p11,&y0_2,&i_3);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&__range1_1,&y0_1,&p10,&i_3);
      }
      for (y1_2 = 1; uVar17 = (ulong)y1_2,
          sVar13 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::size
                             ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               *)local_428), uVar17 < sVar13; y1_2 = y1_2 + 1) {
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_428,(long)(y1_2 + -1));
        z0_1 = (float)pvVar22->first;
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_428,(long)y1_2);
        z1_1 = (float)pvVar22->first;
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_428,(long)(y1_2 + -1));
        p00_1 = (int)pvVar22->second;
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_428,(long)y1_2);
        p01_1 = (int)pvVar22->second;
        p10_1 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                          ((anon_class_40_5_2ea28a1b *)&i_2,(float)__range1._4_4_,(float)(int)z0_1,
                           z_00);
        p11_1 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                          ((anon_class_40_5_2ea28a1b *)&i_2,(float)__range1._4_4_,(float)(int)z0_1,
                           (float)p00_1);
        i_4 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        ((anon_class_40_5_2ea28a1b *)&i_2,(float)__range1._4_4_,(float)(int)z1_1,
                         z_00);
        x0_1 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                         ((anon_class_40_5_2ea28a1b *)&i_2,(float)__range1._4_4_,(float)(int)z1_1,
                          (float)p01_1);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&__range1_1,&p10_1,&i_4,&p11_1);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&__range1_1,&i_4,&x0_1,&p11_1);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&__range1_1,&y0_1,&i_4,&p10_1);
      }
      for (x1_1 = 1; uVar17 = (ulong)x1_1,
          sVar13 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::size
                             ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               *)local_458), uVar17 < sVar13; x1_1 = x1_1 + 1) {
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_458,(long)(x1_1 + -1));
        z0_2 = (float)pvVar22->first;
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_458,(long)x1_1);
        z1_2 = (float)pvVar22->first;
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_458,(long)(x1_1 + -1));
        p00_2 = (int)pvVar22->second;
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_458,(long)x1_1);
        p01_2 = (int)pvVar22->second;
        p10_2 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                          ((anon_class_40_5_2ea28a1b *)&i_2,(float)(int)z0_2,0.0,z_00);
        p11_2 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                          ((anon_class_40_5_2ea28a1b *)&i_2,(float)(int)z0_2,0.0,(float)p00_2);
        i_5 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        ((anon_class_40_5_2ea28a1b *)&i_2,(float)(int)z1_2,0.0,z_00);
        x0_2 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                         ((anon_class_40_5_2ea28a1b *)&i_2,(float)(int)z1_2,0.0,(float)p01_2);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&__range1_1,&p10_2,&i_5,&p11_2);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&__range1_1,&i_5,&x0_2,&p11_2);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&__range1_1,&y0_1,&i_5,&p10_2);
      }
      for (x1_2 = 1; uVar17 = (ulong)x1_2,
          sVar13 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::size
                             ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               *)local_488), uVar17 < sVar13; x1_2 = x1_2 + 1) {
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_488,(long)(x1_2 + -1));
        z0_3 = (float)pvVar22->first;
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_488,(long)x1_2);
        z1_3 = (float)pvVar22->first;
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_488,(long)(x1_2 + -1));
        p00_3 = (int)pvVar22->second;
        pvVar22 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)local_488,(long)x1_2);
        p01_3 = (int)pvVar22->second;
        p10_3 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                          ((anon_class_40_5_2ea28a1b *)&i_2,(float)(int)z0_3,(float)(int)__range1,
                           z_00);
        p11_3 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                          ((anon_class_40_5_2ea28a1b *)&i_2,(float)(int)z0_3,(float)(int)__range1,
                           (float)p00_3);
        local_558 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                              ((anon_class_40_5_2ea28a1b *)&i_2,(float)(int)z1_3,
                               (float)(int)__range1,z_00);
        __range1_2._4_4_ =
             toTerrain::anon_class_40_5_2ea28a1b::operator()
                       ((anon_class_40_5_2ea28a1b *)&i_2,(float)(int)z1_3,(float)(int)__range1,
                        (float)p01_3);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&__range1_1,&p11_3,&local_558,&p10_3);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&__range1_1,&p11_3,(int *)((long)&__range1_2 + 4),&local_558);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&__range1_1,&y0_1,&p10_3,&local_558);
      }
      std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::~vector
                ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *)local_488
                );
      std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::~vector
                ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *)local_458
                );
      std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::~vector
                ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *)local_428
                );
      std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::~vector
                ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *)local_3f8
                );
      std::
      unordered_map<glm::vec<3,_float,_(glm::qualifier)0>,_int,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>_>
      ::~unordered_map((unordered_map<glm::vec<3,_float,_(glm::qualifier)0>,_int,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>_>
                        *)local_3b8);
      std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::~map
                ((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *)
                 &lookup._M_h._M_single_bucket);
      std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::~map
                ((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *)
                 &y1s._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::~map
                ((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *)
                 &y0s._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::~map
                ((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *)
                 &x1s._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    __range1_2._3_1_ = 0;
    Mesh::Mesh(__return_storage_ptr__);
    __end1_2 = std::
               vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ::begin((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        *)&h);
    p_3 = (vec3 *)std::
                  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ::end((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         *)&h);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                               *)&p_3), bVar7) {
      _point = __gnu_cxx::
               __normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
               ::operator*(&__end1_2);
      Mesh::addVertex(__return_storage_ptr__,_point);
      __gnu_cxx::
      __normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
      ::operator++(&__end1_2);
    }
    this_00 = &points.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end1_3 = std::
               vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               ::begin((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                        *)this_00);
    t_1 = (vec2 *)std::
                  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ::end((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         *)this_00);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end1_3,
                              (__normal_iterator<glm::vec<2,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>_>
                               *)&t_1), bVar7) {
      _uv = __gnu_cxx::
            __normal_iterator<glm::vec<2,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>_>
            ::operator*(&__end1_3);
      Mesh::addTexCoord(__return_storage_ptr__,_uv);
      __gnu_cxx::
      __normal_iterator<glm::vec<2,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>_>
      ::operator++(&__end1_3);
    }
    __end1_4 = std::
               vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
               ::begin((vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                        *)&__range1_1);
    tri = (ivec3 *)std::
                   vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                   ::end((vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                          *)&__range1_1);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end1_4,
                              (__normal_iterator<glm::vec<3,_int,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>
                               *)&tri), bVar7) {
      this_01 = __gnu_cxx::
                __normal_iterator<glm::vec<3,_int,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>
                ::operator*(&__end1_4);
      puVar23 = (uint32_t *)glm::vec<3,_int,_(glm::qualifier)0>::operator[](this_01,0);
      index1 = *puVar23;
      puVar23 = (uint32_t *)glm::vec<3,_int,_(glm::qualifier)0>::operator[](this_01,1);
      index2 = *puVar23;
      puVar23 = (uint32_t *)glm::vec<3,_int,_(glm::qualifier)0>::operator[](this_01,2);
      Mesh::addTriangleIndices(__return_storage_ptr__,index1,index2,*puVar23);
      __gnu_cxx::
      __normal_iterator<glm::vec<3,_int,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>_>
      ::operator++(&__end1_4);
    }
    __range1_2._3_1_ = 1;
    std::
    vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
    ::~vector((vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
               *)&__range1_1);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)&h);
    std::
    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ::~vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)&points.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    TriangulatorData::~TriangulatorData((TriangulatorData *)&y0);
  }
  else {
    Mesh::Mesh(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh toTerrain( const Image& _image,
                const float _zScale,
                const float _maxError, const float _baseHeight, 
                const int _maxTriangles, const int _maxPoints) {

    if (_image.getChannels() != 1)
        return Mesh();

    TriangulatorData data;

    // add points at all four corners
    const int x0 = 0;
    const int y0 = 0;
    const int x1 = _image.getWidth() - 1;
    const int y1 = _image.getHeight() - 1;
    const int p0 = data.AddPoint(glm::ivec2(x0, y0));
    const int p1 = data.AddPoint(glm::ivec2(x1, y0));
    const int p2 = data.AddPoint(glm::ivec2(x0, y1));
    const int p3 = data.AddPoint(glm::ivec2(x1, y1));

    // add initial two triangles
    const int t0 = data.AddTriangle(p3, p0, p2, -1, -1, -1, -1);
    data.AddTriangle(p0, p3, p1, t0, -1, -1, -1);
    data.Flush(_image);

    // helper function to check if triangulation is complete
    const auto done = [&]() {
        const float e = data.errors[data.queue[0]];
        if (e <= _maxError) {
            return true;
        }
        if (_maxTriangles > 0 && data.queue.size() >= _maxTriangles) {
            return true;
        }
        if (_maxPoints > 0 && data.points.size() >= _maxPoints) {
            return true;
        }
        return e == 0;
    };

    while (!done()) {
        // pop triangle with highest error from priority queue
        const int t = data.QueuePop();

        const int e0 = t * 3 + 0;
        const int e1 = t * 3 + 1;
        const int e2 = t * 3 + 2;

        const int p0 = data.triangles[e0];
        const int p1 = data.triangles[e1];
        const int p2 = data.triangles[e2];

        const glm::ivec2 a = data.points[p0];
        const glm::ivec2 b = data.points[p1];
        const glm::ivec2 c = data.points[p2];
        const glm::ivec2 p = data.candidates[t];

        const int pn = data.AddPoint(p);

        const auto collinear = []( const glm::ivec2 p0, const glm::ivec2 p1, const glm::ivec2 p2) {
            return (p1.y-p0.y)*(p2.x-p1.x) == (p2.y-p1.y)*(p1.x-p0.x);
        };

        const auto handleCollinear = [&](const int pn, const int a) {
            const int a0 = a - a % 3;
            const int al = a0 + (a + 1) % 3;
            const int ar = a0 + (a + 2) % 3;
            const int p0 = data.triangles[ar];
            const int pr = data.triangles[a];
            const int pl = data.triangles[al];
            const int hal = data.halfedges[al];
            const int har = data.halfedges[ar];

            const int b = data.halfedges[a];

            if (b < 0) {
                const int t0 = data.AddTriangle(pn, p0, pr, -1, har, -1, a0);
                const int t1 = data.AddTriangle(p0, pn, pl, t0, -1, hal, -1);
                data.Legalize(t0 + 1);
                data.Legalize(t1 + 2);
                return;
            }

            const int b0 = b - b % 3;
            const int bl = b0 + (b + 2) % 3;
            const int br = b0 + (b + 1) % 3;
            const int p1 = data.triangles[bl];
            const int hbl = data.halfedges[bl];
            const int hbr = data.halfedges[br];

            data.QueueRemove(b / 3);

            const int t0 = data.AddTriangle(p0, pr, pn, har, -1, -1, a0);
            const int t1 = data.AddTriangle(pr, p1, pn, hbr, -1, t0 + 1, b0);
            const int t2 = data.AddTriangle(p1, pl, pn, hbl, -1, t1 + 1, -1);
            const int t3 = data.AddTriangle(pl, p0, pn, hal, t0 + 2, t2 + 1, -1);

            data.Legalize(t0);
            data.Legalize(t1);
            data.Legalize(t2);
            data.Legalize(t3);
        };

        if (collinear(a, b, p))
            handleCollinear(pn, e0);
        else if (collinear(b, c, p))
            handleCollinear(pn, e1);
        else if (collinear(c, a, p))
            handleCollinear(pn, e2);
        else {
            const int h0 = data.halfedges[e0];
            const int h1 = data.halfedges[e1];
            const int h2 = data.halfedges[e2];

            const int t0 = data.AddTriangle(p0, p1, pn, h0, -1, -1, e0);
            const int t1 = data.AddTriangle(p1, p2, pn, h1, -1, t0 + 1, -1);
            const int t2 = data.AddTriangle(p2, p0, pn, h2, t0 + 2, t1 + 1, -1);

            data.Legalize(t0);
            data.Legalize(t1);
            data.Legalize(t2);
        }

        data.Flush(_image);
    }

    std::vector<glm::vec2> texcoords;
    std::vector<glm::vec3> points;
    points.reserve(data.points.size());
    texcoords.reserve(data.points.size());
    const int w = _image.getWidth();
    const int h = _image.getHeight();
    const int w1 = w - 1;
    const int h1 = h - 1;

    for (const glm::ivec2 &p : data.points) {
        points.emplace_back(p.x, h1 - p.y, _image.getValue( _image.getIndex(p.x, p.y) ) * _zScale);
        texcoords.emplace_back(p.x/float(w1), 1.0f-p.y/float(h1));
    }

    std::vector<glm::ivec3> triangles;
    triangles.reserve(data.queue.size());
    for (const int i : data.queue) {
        triangles.emplace_back(
            data.triangles[i * 3 + 0],
            data.triangles[i * 3 + 1],
            data.triangles[i * 3 + 2] );
    }

    // BASE
    //
    
    if ( _baseHeight > 0.0f ) {
        const float z = -_baseHeight;// * _zScale;
        
        std::map<int, float> x0s;
        std::map<int, float> x1s;
        std::map<int, float> y0s;
        std::map<int, float> y1s;
        std::unordered_map<glm::vec3, int> lookup;

        // find points along each edge
        for (int i = 0; i < points.size(); i++) {
            const auto &p = points[i];
            bool edge = false;

            if (p.x == 0) {
                x0s[p.y] = p.z;
                edge = true;
            }
            else if (p.x == w1) {
                x1s[p.y] = p.z;
                edge = true;
            }

            if (p.y == 0) {
                y0s[p.x] = p.z;
                edge = true;
            }
            else if (p.y == h1) {
                y1s[p.x] = p.z;
                edge = true;
            }

            if (edge)
                lookup[p] = i;
        }

        std::vector<std::pair<int, float>> sx0s(x0s.begin(), x0s.end());
        std::vector<std::pair<int, float>> sx1s(x1s.begin(), x1s.end());
        std::vector<std::pair<int, float>> sy0s(y0s.begin(), y0s.end());
        std::vector<std::pair<int, float>> sy1s(y1s.begin(), y1s.end());

        const auto pointIndex = [&lookup, &points, &texcoords, &w1, &h1](
            const float x, const float y, const float z)
        {
            const glm::vec3 point(x, y, z);
            if (lookup.find(point) == lookup.end()) {
                lookup[point] = points.size();
                points.push_back(point);
                texcoords.push_back( glm::vec2(x/float(w1), y/float(h1)) );
            }
            return lookup[point];
        };

        // compute base center point
        const int center = pointIndex(w * 0.5f, h * 0.5f, z);

        // edge x = 0
        for (int i = 1; i < sx0s.size(); i++) {
            const int y0 = sx0s[i-1].first;
            const int y1 = sx0s[i].first;
            const float z0 = sx0s[i-1].second;
            const float z1 = sx0s[i].second;
            const int p00 = pointIndex(0, y0, z);
            const int p01 = pointIndex(0, y0, z0);
            const int p10 = pointIndex(0, y1, z);
            const int p11 = pointIndex(0, y1, z1);
            triangles.emplace_back(p01, p10, p00);
            triangles.emplace_back(p01, p11, p10);
            triangles.emplace_back(center, p00, p10);
        }

        // edge x = w1
        for (int i = 1; i < sx1s.size(); i++) {
            const int y0 = sx1s[i-1].first;
            const int y1 = sx1s[i].first;
            const float z0 = sx1s[i-1].second;
            const float z1 = sx1s[i].second;
            const int p00 = pointIndex(w1, y0, z);
            const int p01 = pointIndex(w1, y0, z0);
            const int p10 = pointIndex(w1, y1, z);
            const int p11 = pointIndex(w1, y1, z1);
            triangles.emplace_back(p00, p10, p01);
            triangles.emplace_back(p10, p11, p01);
            triangles.emplace_back(center, p10, p00);
        }

        // edge y = 0
        for (int i = 1; i < sy0s.size(); i++) {
            const int x0 = sy0s[i-1].first;
            const int x1 = sy0s[i].first;
            const float z0 = sy0s[i-1].second;
            const float z1 = sy0s[i].second;
            const int p00 = pointIndex(x0, 0, z);
            const int p01 = pointIndex(x0, 0, z0);
            const int p10 = pointIndex(x1, 0, z);
            const int p11 = pointIndex(x1, 0, z1);
            triangles.emplace_back(p00, p10, p01);
            triangles.emplace_back(p10, p11, p01);
            triangles.emplace_back(center, p10, p00);
        }

        // edge y = h1
        for (int i = 1; i < sy1s.size(); i++) {
            const int x0 = sy1s[i-1].first;
            const int x1 = sy1s[i].first;
            const float z0 = sy1s[i-1].second;
            const float z1 = sy1s[i].second;
            const int p00 = pointIndex(x0, h1, z);
            const int p01 = pointIndex(x0, h1, z0);
            const int p10 = pointIndex(x1, h1, z);
            const int p11 = pointIndex(x1, h1, z1);
            triangles.emplace_back(p01, p10, p00);
            triangles.emplace_back(p01, p11, p10);
            triangles.emplace_back(center, p00, p10);
        }
    }

    Mesh mesh;

    for (const glm::vec3 &p : points)
        mesh.addVertex( p );

    for (const glm::vec2 &t : texcoords)
        mesh.addTexCoord( t );
    
    for (const glm::ivec3 &tri : triangles)
        mesh.addTriangleIndices( tri[0], tri[1], tri[2] );

    return mesh;
}